

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O0

xmlChar * xmlACatalogResolvePublic(xmlCatalogPtr catal,xmlChar *pubID)

{
  xmlGenericErrorFunc p_Var1;
  xmlGenericErrorFunc *pp_Var2;
  void **ppvVar3;
  xmlChar *cur;
  xmlChar *sgml;
  xmlChar *ret;
  xmlChar *pubID_local;
  xmlCatalogPtr catal_local;
  
  sgml = (xmlChar *)0x0;
  if ((pubID == (xmlChar *)0x0) || (catal == (xmlCatalogPtr)0x0)) {
    catal_local = (xmlCatalogPtr)0x0;
  }
  else {
    if (xmlDebugCatalogs != 0) {
      pp_Var2 = __xmlGenericError();
      p_Var1 = *pp_Var2;
      ppvVar3 = __xmlGenericErrorContext();
      (*p_Var1)(*ppvVar3,"Resolve pubID %s\n",pubID);
    }
    if (catal->type == XML_XML_CATALOG_TYPE) {
      sgml = xmlCatalogListXMLResolve(catal->xml,pubID,(xmlChar *)0x0);
      if (sgml == (xmlChar *)0xffffffffffffffff) {
        sgml = (xmlChar *)0x0;
      }
    }
    else {
      cur = xmlCatalogGetSGMLPublic(catal->sgml,pubID);
      if (cur != (xmlChar *)0x0) {
        sgml = xmlStrdup(cur);
      }
    }
    catal_local = (xmlCatalogPtr)sgml;
  }
  return (xmlChar *)catal_local;
}

Assistant:

xmlChar *
xmlACatalogResolvePublic(xmlCatalogPtr catal, const xmlChar *pubID) {
    xmlChar *ret = NULL;

    if ((pubID == NULL) || (catal == NULL))
	return(NULL);

    if (xmlDebugCatalogs)
	xmlGenericError(xmlGenericErrorContext,
		"Resolve pubID %s\n", pubID);

    if (catal->type == XML_XML_CATALOG_TYPE) {
	ret = xmlCatalogListXMLResolve(catal->xml, pubID, NULL);
	if (ret == XML_CATAL_BREAK)
	    ret = NULL;
    } else {
	const xmlChar *sgml;

	sgml = xmlCatalogGetSGMLPublic(catal->sgml, pubID);
	if (sgml != NULL)
	    ret = xmlStrdup(sgml);
    }
    return(ret);
}